

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O3

void __thiscall
GF2::Buchb<45UL,_GF2::MOGrlex<45UL>,_GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>::Init
          (Buchb<45UL,_GF2::MOGrlex<45UL>,_GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_> *this)

{
  _I *p_Var1;
  
  p_Var1 = &this->_basis;
  std::__cxx11::
  _List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ::_M_clear((_List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
              *)p_Var1);
  (this->_basis).
  super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  .
  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)p_Var1;
  (this->_basis).
  super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  .
  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)p_Var1;
  (this->_basis).
  super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  .
  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var1 = &this->_reserve;
  std::__cxx11::
  _List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ::_M_clear((_List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
              *)p_Var1);
  (this->_reserve).
  super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  .
  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)p_Var1;
  (this->_reserve).
  super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  .
  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)p_Var1;
  (this->_reserve).
  super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  .
  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ::clear(&this->_pairs);
  std::__cxx11::
  list<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ::clear(&this->_pairs_processed);
  (this->_stat).buch_criterion = 0;
  (this->_stat).r_criterion = 0;
  (this->_stat).b_criterion = 0;
  (this->_stat).c_criterion = 0;
  *(undefined8 *)&(this->_stat).max_deg = 0;
  (this->_stat).a_criterion = 0;
  (this->_stat).pairs_processed = 0;
  (this->_stat).reduction_to_zero = 0;
  return;
}

Assistant:

void Init()
	{
		// очищаем списки многочленов
		_basis.SetEmpty(); _reserve.SetEmpty();
		// устанавливаем порядок по умолчанию
		_basis.SetOrder(_O());
		_reserve.SetOrder(_O());
		// готовим списки пар
		_pairs.clear();
		_pairs_processed.clear();
		// обнуляем статистику
		std::memset(&_stat, 0, sizeof(_stat));
	}